

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minify_tests.c
# Opt level: O3

int main(void)

{
  int iVar1;
  
  UnityBegin(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/deps/cJSON/tests/minify_tests.c"
            );
  UnityDefaultTestRun(cjson_minify_should_not_overflow_buffer,
                      "cjson_minify_should_not_overflow_buffer",0xa5);
  UnityDefaultTestRun(cjson_minify_should_minify_json,"cjson_minify_should_minify_json",0xa6);
  UnityDefaultTestRun(cjson_minify_should_remove_single_line_comments,
                      "cjson_minify_should_remove_single_line_comments",0xa7);
  UnityDefaultTestRun(cjson_minify_should_remove_multiline_comments,
                      "cjson_minify_should_remove_multiline_comments",0xa8);
  UnityDefaultTestRun(cjson_minify_should_remove_spaces,"cjson_minify_should_remove_spaces",0xa9);
  UnityDefaultTestRun(cjson_minify_should_not_modify_strings,
                      "cjson_minify_should_not_modify_strings",0xaa);
  UnityDefaultTestRun(cjson_minify_should_not_loop_infinitely,
                      "cjson_minify_should_not_loop_infinitely",0xab);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

main(void)
{
    UNITY_BEGIN();

    RUN_TEST(cjson_minify_should_not_overflow_buffer);
    RUN_TEST(cjson_minify_should_minify_json);
    RUN_TEST(cjson_minify_should_remove_single_line_comments);
    RUN_TEST(cjson_minify_should_remove_multiline_comments);
    RUN_TEST(cjson_minify_should_remove_spaces);
    RUN_TEST(cjson_minify_should_not_modify_strings);
    RUN_TEST(cjson_minify_should_not_loop_infinitely);

    return UNITY_END();
}